

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  NonAnsiUdpPortListSyntax *pNVar1;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *unaff_retaddr;
  Token *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  BumpAllocator *in_stack_000000f8;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *in_stack_00000100;
  
  parsing::Token::deepClone((Token *)in_stack_00000100,in_stack_000000f8);
  deepClone<slang::syntax::IdentifierNameSyntax>(in_stack_00000100,in_stack_000000f8);
  parsing::Token::deepClone((Token *)in_stack_00000100,in_stack_000000f8);
  parsing::Token::deepClone((Token *)in_stack_00000100,in_stack_000000f8);
  pNVar1 = BumpAllocator::
           emplace<slang::syntax::NonAnsiUdpPortListSyntax,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>&,slang::parsing::Token,slang::parsing::Token>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,(Token *)__fn,
                      (Token *)__child_stack);
  return (int)pNVar1;
}

Assistant:

static SyntaxNode* clone(const NonAnsiUdpPortListSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<NonAnsiUdpPortListSyntax>(
        node.openParen.deepClone(alloc),
        *deepClone(node.ports, alloc),
        node.closeParen.deepClone(alloc),
        node.semi.deepClone(alloc)
    );
}